

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqliteBuiltin_db_update_record(jx9_context *pCtx,int argc,jx9_value **argv)

{
  int iVar1;
  unqlite_col *pCol_00;
  int local_5c;
  int rc;
  int nByte;
  jx9_int64 nId;
  SyString sName;
  unqlite_vm *pVm;
  char *zName;
  unqlite_col *pCol;
  jx9_value **argv_local;
  int argc_local;
  jx9_context *pCtx_local;
  
  if (argc < 2) {
    jx9_context_throw_error(pCtx,1,"Missing collection name and/or records");
    jx9_result_bool(pCtx,0);
  }
  else {
    nId = (jx9_int64)jx9_value_to_string(*argv,&local_5c);
    if (local_5c < 1) {
      jx9_context_throw_error(pCtx,1,"Invalid collection name");
      jx9_result_bool(pCtx,0);
    }
    else {
      sName.zString._0_4_ = local_5c;
      sName._8_8_ = jx9_context_user_data(pCtx);
      pCol_00 = unqliteCollectionFetch((unqlite_vm *)sName._8_8_,(SyString *)&nId,4);
      if (pCol_00 == (unqlite_col *)0x0) {
        jx9_context_throw_error_format(pCtx,1,"No such collection \'%z\'",&nId);
        jx9_result_bool(pCtx,0);
      }
      else {
        _rc = jx9_value_to_int64(argv[1]);
        iVar1 = unqliteCollectionUpdateRecord(pCol_00,_rc,argv[2],0);
        jx9_result_bool(pCtx,(uint)(iVar1 == 0));
      }
    }
  }
  return 0;
}

Assistant:

static int unqliteBuiltin_db_update_record(jx9_context *pCtx,int argc,jx9_value **argv)
{
    unqlite_col *pCol;
    const char *zName;
    unqlite_vm *pVm;
    SyString sName;
    jx9_int64 nId;
    int nByte;
    int rc;
    /* Extract collection name */
    if( argc < 2 ){
        /* Missing arguments */
        jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Missing collection name and/or records");
        /* Return false */
        jx9_result_bool(pCtx,0);
        return JX9_OK;
    }
    zName = jx9_value_to_string(argv[0],&nByte);
    if( nByte < 1){
        jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Invalid collection name");
        /* Return false */
        jx9_result_bool(pCtx,0);
        return JX9_OK;
    }
    SyStringInitFromBuf(&sName,zName,nByte);
    pVm = (unqlite_vm *)jx9_context_user_data(pCtx);
    /* Fetch the collection */
    pCol = unqliteCollectionFetch(pVm,&sName,UNQLITE_VM_AUTO_LOAD);
    if( pCol == 0 ){
        jx9_context_throw_error_format(pCtx,JX9_CTX_ERR,"No such collection '%z'",&sName);
        /* Return false */
        jx9_result_bool(pCtx,0);
        return JX9_OK;
    }
    /* Update a record with the given value */
    nId = jx9_value_to_int64(argv[1]);
    rc = unqliteCollectionUpdateRecord(pCol, nId, argv[2], 0);
    /* All done, return TRUE */
    jx9_result_bool(pCtx,rc == UNQLITE_OK);
    return JX9_OK;
}